

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

string * __thiscall TCLAP::Arg::shortID(Arg *this,string *valueId)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  string *id;
  char *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  char in_stack_fffffffffffffe67;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator<char> *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [54];
  undefined1 local_19;
  
  local_19 = 0;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffe6;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58);
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffe88,__rhs);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
  }
  else {
    nameStartString_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffe88,__rhs);
    std::__cxx11::string::operator=((string *)this_00,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
  }
  if ((*(byte *)(in_RSI + 0x90) & 1) != 0) {
    in_stack_fffffffffffffe67 = delimiter();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (__rhs,(size_type)this_00,(char)((ulong)in_RSI >> 0x38),(allocator<char> *)in_RDI);
    std::operator+(in_RDI,(char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    std::operator+(in_RDI,(char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    std::__cxx11::string::operator+=((string *)this_00,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  if ((*(byte *)(in_RSI + 0x68) & 1) == 0) {
    std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::operator+(in_RDI,(char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xfffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
  }
  return in_RDI;
}

Assistant:

inline std::string Arg::shortID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
		id = Arg::flagStartString() + _flag;
	else
		id = Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId  + ">";

	if ( !_required )
		id = "[" + id + "]";

	return id;
}